

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O2

void ego_display(menu *menu,wchar_t oid,_Bool cursor,wchar_t row,wchar_t col,wchar_t width)

{
  void *pvVar1;
  _Bool _Var2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  undefined7 in_register_00000011;
  uint8_t uVar6;
  char buf [80];
  
  buf[0x40] = '\0';
  buf[0x41] = '\0';
  buf[0x42] = '\0';
  buf[0x43] = '\0';
  buf[0x44] = '\0';
  buf[0x45] = '\0';
  buf[0x46] = '\0';
  buf[0x47] = '\0';
  buf[0x48] = '\0';
  buf[0x49] = '\0';
  buf[0x4a] = '\0';
  buf[0x4b] = '\0';
  buf[0x4c] = '\0';
  buf[0x4d] = '\0';
  buf[0x4e] = '\0';
  buf[0x4f] = '\0';
  buf[0x30] = '\0';
  buf[0x31] = '\0';
  buf[0x32] = '\0';
  buf[0x33] = '\0';
  buf[0x34] = '\0';
  buf[0x35] = '\0';
  buf[0x36] = '\0';
  buf[0x37] = '\0';
  buf[0x38] = '\0';
  buf[0x39] = '\0';
  buf[0x3a] = '\0';
  buf[0x3b] = '\0';
  buf[0x3c] = '\0';
  buf[0x3d] = '\0';
  buf[0x3e] = '\0';
  buf[0x3f] = '\0';
  buf[0x20] = '\0';
  buf[0x21] = '\0';
  buf[0x22] = '\0';
  buf[0x23] = '\0';
  buf[0x24] = '\0';
  buf[0x25] = '\0';
  buf[0x26] = '\0';
  buf[0x27] = '\0';
  buf[0x28] = '\0';
  buf[0x29] = '\0';
  buf[0x2a] = '\0';
  buf[0x2b] = '\0';
  buf[0x2c] = '\0';
  buf[0x2d] = '\0';
  buf[0x2e] = '\0';
  buf[0x2f] = '\0';
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  buf[0x18] = '\0';
  buf[0x19] = '\0';
  buf[0x1a] = '\0';
  buf[0x1b] = '\0';
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  pvVar1 = menu->menu_data;
  lVar5 = (long)oid * 0x10;
  _Var2 = ego_is_ignored((int)*(short *)((long)pvVar1 + lVar5),
                         (uint)*(ushort *)((long)pvVar1 + lVar5 + 2));
  ego_item_name(buf,0x50,(ego_desc *)((long)pvVar1 + lVar5));
  pcVar3 = format("%s",buf);
  uVar6 = '\x01';
  if ((int)CONCAT71(in_register_00000011,cursor) != 0) {
    uVar6 = '\x0e';
  }
  c_put_str(uVar6,pcVar3,row,col);
  uVar6 = '\r';
  if (_Var2) {
    c_put_str('\f',"*",row,col + L'\x01');
    uVar6 = '\f';
  }
  pcVar3 = ((ego_desc *)((long)pvVar1 + lVar5))->short_name;
  sVar4 = strlen(buf);
  c_put_str(uVar6,pcVar3,row,col + (int)sVar4);
  return;
}

Assistant:

static void ego_display(struct menu * menu, int oid, bool cursor, int row,
						int col, int width)
{
	char buf[80] = "";
	struct ego_desc *choice = (struct ego_desc *) menu->menu_data;
	bool ignored = ego_is_ignored(choice[oid].e_idx, choice[oid].itype);

	uint8_t attr = (cursor ? COLOUR_L_BLUE : COLOUR_WHITE);
	uint8_t sq_attr = (ignored ? COLOUR_L_RED : COLOUR_L_GREEN);

	/* Acquire the "name" of object "i" */
	(void) ego_item_name(buf, sizeof(buf), &choice[oid]);

	/* Print it */
	c_put_str(attr, format("%s", buf), row, col);

	/* Show ignore mark, if any */
	if (ignored)
		c_put_str(COLOUR_L_RED, "*", row, col + 1);

	/* Show the stripped ego-item name using another colour */
	c_put_str(sq_attr, choice[oid].short_name, row, col + strlen(buf));
}